

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DashTests.cpp
# Opt level: O2

void __thiscall agge::tests::DashTests::SegmentAreOutputtedAsIsIfDashIsLong(DashTests *this)

{
  point pVar1;
  allocator local_169;
  undefined1 local_168 [32];
  int local_148;
  point local_144;
  point local_138;
  undefined4 local_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  undefined8 uStack_120;
  undefined4 local_118;
  point local_108;
  undefined8 local_fc;
  int local_f4;
  undefined8 local_f0;
  int local_e8;
  dash d;
  point reference2 [4];
  string local_50;
  LocationInfo local_30;
  
  dash::dash(&d);
  dash::add_dash(&d,6.0,1.0);
  move_to<agge::dash>(&d,1.1,17.0);
  dash::add_vertex(&d,4.1,13.0,2);
  pVar1 = vertex<agge::dash>(&d);
  local_108.command = pVar1.command;
  local_108._0_8_ = pVar1._0_8_;
  pVar1 = vertex<agge::dash>(&d);
  local_f4 = pVar1.command;
  local_fc = pVar1._0_8_;
  pVar1 = vertex<agge::dash>(&d);
  local_e8 = pVar1.command;
  local_f0 = pVar1._0_8_;
  local_118 = 0;
  uStack_120 = 0;
  local_138.x = 1.1;
  local_138.y = 17.0;
  local_138.command = 1;
  local_12c = 0x40833333;
  uStack_128 = 0x41500000;
  uStack_124 = 2;
  std::__cxx11::string::string
            ((string *)reference2,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/DashTests.cpp"
             ,(allocator *)&local_30);
  ut::LocationInfo::LocationInfo((LocationInfo *)local_168,(string *)reference2,0x21);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,3ul>
            ((point (*) [3])&local_138,(point (*) [3])&local_108,(LocationInfo *)local_168);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  dash::remove_all(&d);
  move_to<agge::dash>(&d,1.0,1.0);
  dash::add_vertex(&d,2.5,3.0,2);
  dash::add_vertex(&d,2.7,3.1,2);
  pVar1 = vertex<agge::dash>(&d);
  local_168._8_4_ = pVar1.command;
  local_168._0_8_ = pVar1._0_8_;
  pVar1 = vertex<agge::dash>(&d);
  local_168._20_4_ = pVar1.command;
  local_168._12_8_ = pVar1._0_8_;
  pVar1 = vertex<agge::dash>(&d);
  local_148 = pVar1.command;
  local_168._24_8_ = pVar1._0_8_;
  pVar1 = vertex<agge::dash>(&d);
  local_144.command = pVar1.command;
  local_144._0_8_ = pVar1._0_8_;
  reference2[2].command = 2;
  reference2[3].x = 0.0;
  reference2[3].y = 0.0;
  reference2[3].command = 0;
  reference2[1].y = 3.0;
  reference2[1].command = 2;
  reference2[2].x = 2.7;
  reference2[2].y = 3.1;
  reference2[0].x = 1.0;
  reference2[0].y = 1.0;
  reference2[0].command = 1;
  reference2[1].x = 2.5;
  std::__cxx11::string::string
            ((string *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/DashTests.cpp"
             ,&local_169);
  ut::LocationInfo::LocationInfo(&local_30,&local_50,0x32);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,4ul>
            (&reference2,(point (*) [4])local_168,&local_30);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  dash::~dash(&d);
  return;
}

Assistant:

test( SegmentAreOutputtedAsIsIfDashIsLong )
			{
				// INIT
				dash d;

				// INIT / ACT
				d.add_dash(6.0f, 1.0f);

				// ACT
				move_to(d, 1.1f, 17.0f);
				line_to(d, 4.1f, 13.0f);
				mocks::path::point result1[] = { vertex(d), vertex(d), vertex(d), };

				// ASSERT
				mocks::path::point reference1[] = {
					{ 1.1f, 17.0f, path_command_move_to },
					{ 4.1f, 13.0f, path_command_line_to },
					{ 0.0f, 0.0f, path_command_stop },
				};

				assert_equal(reference1, result1);

				// ACT
				d.remove_all();
				move_to(d, 1.0f, 1.0f);
				line_to(d, 2.5f, 3.0f);
				line_to(d, 2.7f, 3.1f);
				mocks::path::point result2[] = { vertex(d), vertex(d), vertex(d), vertex(d), };

				// ASSERT
				mocks::path::point reference2[] = {
					{ 1.0f, 1.0f, path_command_move_to },
					{ 2.5f, 3.0f, path_command_line_to },
					{ 2.7f, 3.1f, path_command_line_to },
					{ 0.0f, 0.0f, path_command_stop },
				};

				assert_equal(reference2, result2);
			}